

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

void debugmem_tag_error(void *p)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  void *p_local;
  
  pp_Var2 = __xmlGenericError();
  p_Var1 = *pp_Var2;
  ppvVar3 = __xmlGenericErrorContext();
  (*p_Var1)(*ppvVar3,"Memory tag error occurs :%p \n\t bye\n",p);
  return;
}

Assistant:

static void debugmem_tag_error(void *p)
{
     xmlGenericError(xmlGenericErrorContext,
	     "Memory tag error occurs :%p \n\t bye\n", p);
#ifdef MEM_LIST
     if (stderr)
     xmlMemDisplay(stderr);
#endif
}